

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<capnp::_::RawBrandedSchema::Binding>::~Array
          (Array<capnp::_::RawBrandedSchema::Binding> *this)

{
  Array<capnp::_::RawBrandedSchema::Binding> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }